

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall Person::Person(Person *this,Person *person,Address *address)

{
  Address *address_local;
  Person *person_local;
  Person *this_local;
  
  this->_vptr_Person = (_func_int **)&PTR_validate_0014aa40;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->id);
  Address::Address(&this->address,address);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&person->name);
  std::__cxx11::string::operator=((string *)&this->id,(string *)&person->id);
  return;
}

Assistant:

Person::Person(const Person &person, Address address) : address(address) {

    this->name = person.name;
    this->id = person.id;
}